

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * getLinkInterfaceDependentProperty<char_const*>
                 (cmGeneratorTarget *tgt,string *prop,string *config,CompatibleType t,char **param_5
                 )

{
  char *pcVar1;
  
  if (t - StringType < 3) {
    pcVar1 = checkInterfacePropertyCompatibility<char_const*>
                       (tgt,prop,config,"empty",t,(char **)0x0);
    return pcVar1;
  }
  if (t == BoolType) {
    __assert_fail("0 && \"String compatibility check function called for boolean\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xf29,
                  "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  }
  __assert_fail("0 && \"Unreachable!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xf32,
                "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
               );
}

Assistant:

const char * getLinkInterfaceDependentProperty(cmGeneratorTarget const* tgt,
                                               const std::string& prop,
                                               const std::string& config,
                                               CompatibleType t,
                                               const char **)
{
  switch(t)
  {
  case BoolType:
    assert(0 && "String compatibility check function called for boolean");
    return 0;
  case StringType:
    return tgt->GetLinkInterfaceDependentStringProperty(prop, config);
  case NumberMinType:
    return tgt->GetLinkInterfaceDependentNumberMinProperty(prop, config);
  case NumberMaxType:
    return tgt->GetLinkInterfaceDependentNumberMaxProperty(prop, config);
  }
  assert(0 && "Unreachable!");
  return 0;
}